

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O1

void nes_w_mame(void *chip,UINT8 offset,UINT8 data)

{
  undefined7 in_register_00000031;
  NESAPU_INF *info;
  
  if (offset < 0x20) {
    nes_apu_write(*(void **)((long)chip + 8),offset,data);
    return;
  }
  if ((*(void **)((long)chip + 0x18) != (void *)0x0) && (*(char *)((long)chip + 0x28) == '\0')) {
    NES_FDS_Write(*(void **)((long)chip + 0x18),
                  (ushort)CONCAT71(in_register_00000031,offset) | 0x4000,data);
    return;
  }
  return;
}

Assistant:

static void nes_w_mame(void* chip, UINT8 offset, UINT8 data)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	
	if (offset < 0x20)	// NES APU
	{
		nes_apu_write(info->chip_apu, offset, data);
	}
	else	// FDS
	{
#ifdef EC_NES_NSFP_FDS
		if (info->chip_fds != NULL && ! info->fds_disable)
			NES_FDS_Write(info->chip_fds, 0x4000 | offset, data);
#endif
	}
	return;
}